

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.cpp
# Opt level: O0

double __thiscall
phyr::MicrofacetDistribution::pdf(MicrofacetDistribution *this,Vector3f *wo,Vector3f *wh)

{
  undefined8 in_RDX;
  long *in_RDI;
  Vector3<double> *v1;
  double dVar1;
  double dVar2;
  Vector3<double> *in_stack_ffffffffffffffb8;
  double local_8;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_8 = (double)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RDX);
    dVar1 = absCosTheta((Vector3f *)0x1aff9b);
    local_8 = local_8 * dVar1;
  }
  else {
    v1 = (Vector3<double> *)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RDX);
    dVar1 = g1((MicrofacetDistribution *)v1,in_stack_ffffffffffffffb8);
    dVar2 = absDot<double>(v1,in_stack_ffffffffffffffb8);
    local_8 = absCosTheta((Vector3f *)0x1aff67);
    local_8 = ((double)v1 * dVar1 * dVar2) / local_8;
  }
  return local_8;
}

Assistant:

Real MicrofacetDistribution::pdf(const Vector3f& wo, const Vector3f& wh) const {
    if (sampleVisibleArea)
        return d(wh) * g1(wo) * absDot(wo, wh) / absCosTheta(wo);
    else
        return d(wh) * absCosTheta(wh);
}